

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O2

x86Reg __thiscall
CodeGenGenericContext::FindRegAtMemory
          (CodeGenGenericContext *this,x86Size size,x86Reg index,int multiplier,x86Reg base,
          uint shift,bool checkRegisters)

{
  bool bVar1;
  uint uVar2;
  x86Argument *this_00;
  x86Reg xVar3;
  uint i;
  long lVar4;
  uint shift_local;
  x86Reg base_local;
  int multiplier_local;
  x86Reg index_local;
  x86Argument newArg;
  
  shift_local = shift;
  base_local = base;
  multiplier_local = multiplier;
  index_local = index;
  RedirectAddressComputation(this,&index_local,&multiplier_local,&base_local,&shift_local);
  newArg.type = argPtr;
  newArg.ptrBase = base_local;
  newArg.ptrIndex = index_local;
  newArg.ptrMult = multiplier_local;
  newArg.ptrNum = shift_local;
  newArg.field_1.ptrSize = size;
  uVar2 = MemFind(this,&newArg);
  if ((uVar2 == 0) || (this->memCache[uVar2 - 1].value.type != argReg)) {
    xVar3 = rRegCount;
    if (checkRegisters) {
      this_00 = this->genReg;
      for (lVar4 = 0; lVar4 != 0x11; lVar4 = lVar4 + 1) {
        if ((this_00->type == argPtr) && (bVar1 = x86Argument::operator==(this_00,&newArg), bVar1))
        {
          return (x86Reg)lVar4;
        }
        this_00 = this_00 + 1;
      }
    }
  }
  else {
    xVar3 = this->memCache[uVar2 - 1].value.field_1.reg;
  }
  return xVar3;
}

Assistant:

x86Reg CodeGenGenericContext::FindRegAtMemory(x86Size size, x86Reg index, int multiplier, x86Reg base, unsigned shift, bool checkRegisters)
{
#ifdef NULLC_OPTIMIZE_X86
	RedirectAddressComputation(index, multiplier, base, shift);

	x86Argument newArg = x86Argument(size, index, multiplier, base, shift);

	if(unsigned memIndex = MemFind(newArg))
	{
		memIndex--;

		if(memCache[memIndex].value.type == x86Argument::argReg)
			return memCache[memIndex].value.reg;
	}

	if(checkRegisters)
	{
		// If another register contains data from memory
		for(unsigned i = 0; i < rRegCount; i++)
		{
			if(genReg[i].type == x86Argument::argPtr && genReg[i] == newArg)
				return (x86Reg)i;
		}
	}
#endif

	return rRegCount;
}